

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
          (Memory *this,u32 offset,u32 addend,unsigned_short rhs,
          BinopFunc<unsigned_short,_unsigned_short> **func,unsigned_short *out)

{
  u32 addend_00;
  u32 offset_00;
  bool bVar1;
  unsigned_short val;
  Result RVar2;
  unsigned_short local_3a;
  unsigned_short *puStack_38;
  unsigned_short lhs;
  unsigned_short *out_local;
  BinopFunc<unsigned_short,_unsigned_short> **func_local;
  u32 local_20;
  u32 uStack_1c;
  unsigned_short rhs_local;
  u32 addend_local;
  u32 offset_local;
  Memory *this_local;
  
  puStack_38 = out;
  out_local = (unsigned_short *)func;
  func_local._6_2_ = rhs;
  local_20 = addend;
  uStack_1c = offset;
  _addend_local = this;
  RVar2 = AtomicLoad<unsigned_short>(this,offset,addend,&local_3a);
  bVar1 = Failed(RVar2);
  offset_00 = uStack_1c;
  addend_00 = local_20;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    val = (**(code **)out_local)(local_3a,func_local._6_2_);
    RVar2 = AtomicStore<unsigned_short>(this,offset_00,addend_00,val);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *puStack_38 = local_3a;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmw(u32 offset, u32 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}